

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_vtk(REF_GRID ref_grid,char *filename)

{
  REF_INT RVar1;
  REF_INT RVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT ugrid_nodes_1 [6];
  REF_INT ugrid_nodes [5];
  int local_d4;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT group;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  uint local_54;
  REF_INT size;
  REF_INT ncell;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x9b,
           "ref_export_vtk","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf((FILE *)ref_node,"# vtk DataFile Version 2.0\n");
    fprintf((FILE *)ref_node,"ref_export_vtk\n");
    fprintf((FILE *)ref_node,"ASCII\n");
    uVar3 = ref_node_compact((REF_NODE)ref_cell,&n2o,(REF_INT **)&size);
    if (uVar3 == 0) {
      fprintf((FILE *)ref_node,"DATASET UNSTRUCTURED_GRID\n");
      fprintf((FILE *)ref_node,"POINTS %d double\n",(ulong)ref_cell->type);
      for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
        fprintf((FILE *)ref_node," %.16e %.16e %.16e\n",
                *(undefined8 *)(ref_cell->c2n + (long)(_size[o2n._4_4_] * 0xf) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_size[o2n._4_4_] * 0xf + 1) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_size[o2n._4_4_] * 0xf + 2) * 2));
      }
      local_54 = 0;
      nodes[0x1a] = 0;
      local_d4 = 3;
      pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
      while (local_d4 < 0x10) {
        local_54 = *(int *)((long)pRStack_38 + 0x28) + local_54;
        nodes[0x1a] = *(int *)((long)pRStack_38 + 0x28) * (*(int *)((long)pRStack_38 + 0xc) + 1) +
                      nodes[0x1a];
        local_d4 = local_d4 + 1;
        pRStack_38 = *(REF_CELL *)(filename_local + (long)local_d4 * 8 + 0x10);
      }
      fprintf((FILE *)ref_node,"CELLS %d %d\n",(ulong)local_54,(ulong)(uint)nodes[0x1a]);
      local_d4 = 3;
      pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
      while (local_d4 < 0x10) {
        uVar3 = pRStack_38->node_per;
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          RVar4 = ref_cell_nodes(pRStack_38,ref_private_macro_code_rss,&cell);
          if (RVar4 == 0) {
            fprintf((FILE *)ref_node," %d",(ulong)uVar3);
            RVar2 = nodes[0];
            RVar1 = cell;
            if (uVar3 == 5) {
              cell = node_per;
              node_per = RVar1;
              nodes[0] = nodes[1];
              nodes[1] = nodes[2];
              nodes[2] = RVar2;
            }
            RVar2 = nodes[1];
            RVar1 = cell;
            if (uVar3 == 6) {
              cell = node_per;
              node_per = RVar1;
              nodes[1] = nodes[2];
              nodes[2] = RVar2;
            }
            for (o2n._4_4_ = 0; o2n._4_4_ < (int)uVar3; o2n._4_4_ = o2n._4_4_ + 1) {
              fprintf((FILE *)ref_node," %d",(ulong)(uint)n2o[(&cell)[o2n._4_4_]]);
            }
            fprintf((FILE *)ref_node,"\n");
          }
        }
        local_d4 = local_d4 + 1;
        pRStack_38 = *(REF_CELL *)(filename_local + (long)local_d4 * 8 + 0x10);
      }
      fprintf((FILE *)ref_node,"CELL_TYPES %d\n",(ulong)local_54);
      pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) &&
            (ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c))) &&
           (*(int *)(*(long *)((long)pRStack_38 + 0x38) +
                    (long)(*(int *)((long)pRStack_38 + 8) * ref_private_macro_code_rss) * 4) != -1))
        {
          fprintf((FILE *)ref_node," %d\n",5);
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x40);
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) &&
            (ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c))) &&
           (*(int *)(*(long *)((long)pRStack_38 + 0x38) +
                    (long)(*(int *)((long)pRStack_38 + 8) * ref_private_macro_code_rss) * 4) != -1))
        {
          fprintf((FILE *)ref_node," %d\n",9);
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x50);
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) &&
            (ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c))) &&
           (*(int *)(*(long *)((long)pRStack_38 + 0x38) +
                    (long)(*(int *)((long)pRStack_38 + 8) * ref_private_macro_code_rss) * 4) != -1))
        {
          fprintf((FILE *)ref_node," %d\n",10);
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x58);
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) &&
            (ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c))) &&
           (*(int *)(*(long *)((long)pRStack_38 + 0x38) +
                    (long)(*(int *)((long)pRStack_38 + 8) * ref_private_macro_code_rss) * 4) != -1))
        {
          fprintf((FILE *)ref_node," %d\n",0xe);
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x60);
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) &&
            (ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c))) &&
           (*(int *)(*(long *)((long)pRStack_38 + 0x38) +
                    (long)(*(int *)((long)pRStack_38 + 8) * ref_private_macro_code_rss) * 4) != -1))
        {
          fprintf((FILE *)ref_node," %d\n",0xd);
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x68);
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) &&
            (ref_private_macro_code_rss < *(int *)((long)pRStack_38 + 0x2c))) &&
           (*(int *)(*(long *)((long)pRStack_38 + 0x38) +
                    (long)(*(int *)((long)pRStack_38 + 8) * ref_private_macro_code_rss) * 4) != -1))
        {
          fprintf((FILE *)ref_node," %d\n",0xc);
        }
      }
      if (_size != (REF_INT *)0x0) {
        free(_size);
      }
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      fclose((FILE *)ref_node);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa1
             ,"ref_export_vtk",(ulong)uVar3,"compact");
      ref_grid_local._4_4_ = uVar3;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_vtk(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT ncell, size;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT group;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "# vtk DataFile Version 2.0\n");
  fprintf(file, "ref_export_vtk\n");
  fprintf(file, "ASCII\n");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  fprintf(file, "DATASET UNSTRUCTURED_GRID\n");
  fprintf(file, "POINTS %d double\n", ref_node_n(ref_node));

  for (node = 0; node < ref_node_n(ref_node); node++) {
    fprintf(file, " %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }

  ncell = 0;
  size = 0;

  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    ncell += ref_cell_n(ref_cell);
    size += ref_cell_n(ref_cell) * (1 + ref_cell_node_per(ref_cell));
  }

  fprintf(file, "CELLS %d %d\n", ncell, size);

  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      fprintf(file, " %d", node_per);
      if (5 == node_per) VTK_PYRAMID_ORDER(nodes);
      if (6 == node_per) VTK_WEDGE_ORDER(nodes);
      for (node = 0; node < node_per; node++)
        fprintf(file, " %d", o2n[nodes[node]]);
      fprintf(file, "\n");
    }
  }

  fprintf(file, "CELL_TYPES %d\n", ncell);

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) fprintf(file, " %d\n", VTK_TRIANGLE);

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) fprintf(file, " %d\n", VTK_QUAD);

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) fprintf(file, " %d\n", VTK_TETRA);

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) fprintf(file, " %d\n", VTK_PYRAMID);

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) fprintf(file, " %d\n", VTK_WEDGE);

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell)
      fprintf(file, " %d\n", VTK_HEXAHEDRON);

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}